

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pull_by_name.c
# Opt level: O0

int pull_by_name(char *input_file,FILE *names_fp,int min,int max,int length,int exclude,int convert,
                int just_count)

{
  char *pcVar1;
  FILE *pFVar2;
  uint uVar3;
  int iVar4;
  int *piVar5;
  char *pcVar6;
  kseq_t *seq_00;
  lookup_t *plVar7;
  kseq_t *seq;
  char *line;
  char *fasta_name;
  int is_fasta;
  int excluded;
  int count;
  int capacity;
  int l;
  int i;
  gzFile fp;
  int exclude_local;
  int length_local;
  int max_local;
  int min_local;
  FILE *names_fp_local;
  char *input_file_local;
  
  excluded = 0x50;
  is_fasta = 0;
  fasta_name._4_4_ = 0;
  fasta_name._0_4_ = 0xffffffff;
  fp._0_4_ = exclude;
  fp._4_4_ = length;
  exclude_local = max;
  length_local = min;
  _max_local = names_fp;
  names_fp_local = (FILE *)input_file;
  seq = (kseq_t *)malloc(0x50);
  pFVar2 = _stderr;
  pcVar1 = progname;
  if (seq == (kseq_t *)0x0) {
    piVar5 = __errno_location();
    pcVar6 = strerror(*piVar5);
    fprintf(pFVar2,"%s - line malloc: %s\n",pcVar1,pcVar6);
    exit(1);
  }
  while (capacity = getl((char **)&seq,_max_local), capacity != -1) {
    line = parse_name((char *)seq);
    if (line != (char *)0x0) {
      add_name(line);
    }
  }
  free(seq);
  if (verbose_flag != 0) {
    fprintf(_stderr,"\n");
    pFVar2 = _stderr;
    uVar3 = hash_key_count();
    fprintf(pFVar2,"done reading from input (%d entries)\n",(ulong)uVar3);
  }
  _l = (gzFile)gzopen(names_fp_local,"r");
  if (_l == (gzFile)0x0) {
    fprintf(_stderr,"%s - Couldn\'t open fasta file %s\n",progname,names_fp_local);
    exit(1);
  }
  seq_00 = kseq_init(_l);
  count = kseq_read(seq_00);
  fasta_name._0_4_ = (uint)((seq_00->qual).s == (char *)0x0);
  gzrewind(_l);
  seq_00->f->end = 0;
  seq_00->f->begin = 0;
  seq_00->f->is_eof = 0;
  seq_00->last_char = 0;
  if (verbose_flag != 0) {
    if ((uint)fasta_name == 0) {
      fprintf(_stderr,"Input is FASTQ format\n");
    }
    else {
      fprintf(_stderr,"Input is FASTA format\n");
    }
  }
  while (count = kseq_read(seq_00), -1 < count) {
    if ((int)fp == 0) {
      plVar7 = find_name((seq_00->name).s);
      if (plVar7 == (lookup_t *)0x0) {
        fasta_name._4_4_ = fasta_name._4_4_ + 1;
      }
      else {
        iVar4 = size_filter(seq_00,(uint)fasta_name,length_local,exclude_local,fp._4_4_,convert,
                            just_count);
        is_fasta = iVar4 + is_fasta;
      }
    }
    else {
      plVar7 = find_name((seq_00->name).s);
      if (plVar7 == (lookup_t *)0x0) {
        iVar4 = size_filter(seq_00,(uint)fasta_name,length_local,exclude_local,fp._4_4_,convert,
                            just_count);
        is_fasta = iVar4 + is_fasta;
      }
      else {
        fasta_name._4_4_ = fasta_name._4_4_ + 1;
      }
    }
  }
  kseq_destroy(seq_00);
  gzclose(_l);
  delete_hash();
  if ((just_count != 0) &&
     (fprintf(_stdout,"Total output: %i\n",(ulong)(uint)is_fasta), (int)fp != 0)) {
    fprintf(_stdout,"Total excluded: %i\n",(ulong)fasta_name._4_4_);
  }
  if ((verbose_flag != 0) &&
     (fprintf(_stderr,"Processed %i entries\n",(ulong)(uint)is_fasta), (int)fp != 0)) {
    fprintf(_stderr,"Excluded %i entries\n",(ulong)fasta_name._4_4_);
  }
  return is_fasta;
}

Assistant:

__KSEQ_READ(static)

/*
extern char const *progname;
extern int verbose_flag;
*/

int pull_by_name(char *input_file, FILE *names_fp, int min, int max, int length, int exclude, int convert, int just_count) {
	gzFile fp;
	int i,l,capacity=80;
	int count=0,excluded=0;
	int is_fasta = -1;
	char *fasta_name;
	char *line;
	kseq_t *seq;

	/* get some space for the line */
	line = malloc(sizeof(char) * capacity); /* get memory allocated */
	if (!line) {
		fprintf(stderr, "%s - line malloc: %s\n",progname, strerror(errno));
		exit(EXIT_FAILURE);
	}

	while((i = getl(&line, names_fp)) != -1) {
		fasta_name = parse_name(line);
		if (fasta_name) {
			add_name(fasta_name);             /* add fasta_name to hash */
		}
	}

	free(line); /* free up line */

	if (verbose_flag) {
		fprintf(stderr,"\n");
		fprintf(stderr,"done reading from input (%d entries)\n", hash_key_count());
	}
	/*print_hash();*/


	/* open fasta file */
	fp = gzopen(input_file,"r");
	if (!fp) {
		fprintf(stderr,"%s - Couldn't open fasta file %s\n",progname,input_file);
		exit(EXIT_FAILURE);
	}

	seq = kseq_init(fp); /* initialize kseq */

	/* determine file type */
	l = kseq_read(seq); /* read the first sequence */
	is_fasta = seq->qual.s == NULL ? 1 : 0;
	gzrewind(fp); /* rewind to beginning for main loop */
	kseq_rewind(seq);

	if (verbose_flag) {
		if (is_fasta)
			fprintf(stderr, "Input is FASTA format\n");
		else
			fprintf(stderr, "Input is FASTQ format\n");
	}

	/* search through list and see if this header matches */
	while((l = kseq_read(seq)) >= 0) {
		if (exclude == 0) { /* INCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
			else
				excluded++;
		} else { /* EXCLUDE names from names file */
			if (find_name(seq->name.s))            /* found name in list */
				excluded++;
			else
				count += size_filter(seq, is_fasta, min, max, length, convert, just_count);
		}
	}
	kseq_destroy(seq);
	gzclose(fp); /* done reading file */

	delete_hash(); /* free the list nodes */

	if (just_count) {
		fprintf(stdout, "Total output: %i\n", count);
		if (exclude)
			fprintf(stdout, "Total excluded: %i\n", excluded);
	}

	if (verbose_flag) {
		fprintf(stderr,"Processed %i entries\n",count);
		if (exclude)
			fprintf(stderr,"Excluded %i entries\n",excluded);
	}
	return count;
}